

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_account.c
# Opt level: O3

void IoTHubAccount_deinit(IOTHUB_ACCOUNT_INFO_HANDLE acctHandle)

{
  IOTHUB_PROVISIONED_DEVICE *__ptr;
  char *deviceId;
  IOTHUB_REGISTRYMANAGER_RESULT IVar1;
  LOGGER_LOG p_Var2;
  ulong uVar3;
  ulong uVar4;
  
  if (acctHandle != (IOTHUB_ACCOUNT_INFO_HANDLE)0x0) {
    uVar3 = acctHandle->number_of_sas_devices;
    if (uVar3 != 0) {
      uVar4 = 0;
      do {
        __ptr = acctHandle->sasDevices[uVar4];
        if (__ptr != (IOTHUB_PROVISIONED_DEVICE *)0x0) {
          if (__ptr->deviceId != (char *)0x0) {
            IVar1 = IoTHubRegistryManager_DeleteDevice
                              (acctHandle->iothub_registrymanager_handle,__ptr->deviceId);
            if (IVar1 != IOTHUB_REGISTRYMANAGER_OK) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                          ,"IoTHubAccount_deinit",0x346,1,
                          "IoTHubRegistryManager_DeleteDevice failed for SAS Based Device \"%s\"\r\n"
                          ,__ptr->deviceId);
              }
            }
          }
          free(__ptr->deviceId);
          free(__ptr->moduleId);
          free(__ptr->primaryAuthentication);
          free(__ptr->connectionString);
          free(__ptr->moduleConnectionString);
          free(__ptr);
          uVar3 = acctHandle->number_of_sas_devices;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < uVar3);
    }
    free(acctHandle->sasDevices);
    deviceId = (acctHandle->x509Device).deviceId;
    if (deviceId != (char *)0x0) {
      IVar1 = IoTHubRegistryManager_DeleteDevice(acctHandle->iothub_registrymanager_handle,deviceId)
      ;
      if (IVar1 != IOTHUB_REGISTRYMANAGER_OK) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                    ,"IoTHubAccount_deinit",0x35a,1,
                    "IoTHubRegistryManager_DeleteDevice failed for x509 Based Device\r\n");
        }
      }
    }
    IoTHubMessaging_LL_Destroy(acctHandle->iothub_messaging_handle);
    IoTHubRegistryManager_Destroy(acctHandle->iothub_registrymanager_handle);
    IoTHubServiceClientAuth_Destroy(acctHandle->iothub_service_client_auth_handle);
    free(acctHandle->hostname);
    free(acctHandle->iothubName);
    free(acctHandle->iothubSuffix);
    free(acctHandle->sharedAccessKey);
    free(acctHandle->sharedAccessToken);
    free(acctHandle->keyName);
    free(acctHandle->eventhubAccessKey);
    free((acctHandle->x509Device).deviceId);
    free((acctHandle->x509Device).connectionString);
    free(acctHandle->x509Certificate);
    free(acctHandle->x509PrivateKey);
    free(acctHandle->x509Thumbprint);
    free(acctHandle);
    return;
  }
  return;
}

Assistant:

void IoTHubAccount_deinit(IOTHUB_ACCOUNT_INFO_HANDLE acctHandle)
{
    if (acctHandle != NULL)
    {
        IOTHUB_ACCOUNT_INFO* acctInfo = (IOTHUB_ACCOUNT_INFO*)acctHandle;
        size_t iterator;
        IOTHUB_REGISTRYMANAGER_RESULT iothub_registrymanager_result;

        for (iterator = 0; iterator < acctInfo->number_of_sas_devices; iterator++)
        {
            IOTHUB_PROVISIONED_DEVICE* provisioned_device = acctInfo->sasDevices[iterator];

            if (provisioned_device != NULL)
            {
                if (provisioned_device->deviceId != NULL)
                {
                    iothub_registrymanager_result = IoTHubRegistryManager_DeleteDevice(acctInfo->iothub_registrymanager_handle, provisioned_device->deviceId);
                    if (iothub_registrymanager_result != IOTHUB_REGISTRYMANAGER_OK)
                    {
                        LogError("IoTHubRegistryManager_DeleteDevice failed for SAS Based Device \"%s\"\r\n", provisioned_device->deviceId);
                    }
                }

                free(provisioned_device->deviceId);
                free(provisioned_device->moduleId);
                free(provisioned_device->primaryAuthentication);
                free(provisioned_device->connectionString);
                free(provisioned_device->moduleConnectionString);
                free(provisioned_device);
            }
        }

        free(acctInfo->sasDevices);

        if (acctInfo->x509Device.deviceId)
        {
            iothub_registrymanager_result = IoTHubRegistryManager_DeleteDevice(acctInfo->iothub_registrymanager_handle, acctInfo->x509Device.deviceId);
            if (iothub_registrymanager_result != IOTHUB_REGISTRYMANAGER_OK)
            {
                LogError("IoTHubRegistryManager_DeleteDevice failed for x509 Based Device\r\n");
            }
        }

        IoTHubMessaging_LL_Destroy(acctInfo->iothub_messaging_handle);
        IoTHubRegistryManager_Destroy(acctInfo->iothub_registrymanager_handle);
        IoTHubServiceClientAuth_Destroy(acctInfo->iothub_service_client_auth_handle);

        free(acctInfo->hostname);
        free(acctInfo->iothubName);
        free(acctInfo->iothubSuffix);
        free(acctInfo->sharedAccessKey);
        free(acctInfo->sharedAccessToken);
        free(acctInfo->keyName);
        free(acctInfo->eventhubAccessKey);

        free(acctInfo->x509Device.deviceId);
        free(acctInfo->x509Device.connectionString);
        free(acctInfo->x509Certificate);
        free(acctInfo->x509PrivateKey);
        free(acctInfo->x509Thumbprint);
        free(acctInfo);
    }
}